

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  pointer ppcVar1;
  cmake *this_00;
  ostream *poVar2;
  string *psVar3;
  pointer ppcVar4;
  string text;
  ostringstream w;
  ostringstream conflicts;
  undefined1 local_360 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [376];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  ppcVar4 = (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar4 != ppcVar1) {
    do {
      cmOrderDirectoriesConstraint::FindImplicitConflicts(*ppcVar4,(ostringstream *)local_198);
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 != ppcVar1);
  }
  std::__cxx11::stringbuf::str();
  if ((cmGlobalGenerator *)local_360._24_8_ != (cmGlobalGenerator *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,"Cannot generate a safe ",0x17);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_310,(this->Purpose)._M_dataplus._M_p,
                        (this->Purpose)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," for target ",0xc);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," because files in some directories may conflict with ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," libraries in implicit directories:\n",0x24);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_360._16_8_,local_360._24_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Some of these libraries may not be found correctly.",0x33);
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_360);
    cmake::IssueMessage(this_00,WARNING,(string *)&local_330,(cmListFileBacktrace *)local_360);
    if ((cmMakefile *)local_360._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_allocated_capacity != &local_320) {
      operator_delete((void *)local_330._M_allocated_capacity,local_320._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
    std::ios_base::~ios_base((ios_base *)(local_310 + 0x70));
  }
  if ((cmLocalGenerator *)local_360._16_8_ != (cmLocalGenerator *)(local_360 + 0x20)) {
    operator_delete((void *)local_360._16_8_,(ulong)(local_360._32_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (cmOrderDirectoriesConstraint* entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  std::ostringstream w;
  w << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because files in some directories may conflict with "
    << " libraries in implicit directories:\n"
    << text << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING, w.str(), this->Target->GetBacktrace());
}